

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmakeevaluator.h
# Opt level: O0

ProValueMap __thiscall ProValueMapStack::pop(ProValueMapStack *this)

{
  QExplicitlySharedDataPointerV2<QMapData<std::map<ProKey,_ProStringList,_std::less<ProKey>,_std::allocator<std::pair<const_ProKey,_ProStringList>_>_>_>_>
  in_RDI;
  type *r;
  QMap<ProKey,_ProStringList> *in_stack_ffffffffffffffc8;
  
  *(undefined8 *)in_RDI.d.ptr = 0xaaaaaaaaaaaaaaaa;
  std::__cxx11::list<QMap<ProKey,_ProStringList>,_std::allocator<QMap<ProKey,_ProStringList>_>_>::
  back((list<QMap<ProKey,_ProStringList>,_std::allocator<QMap<ProKey,_ProStringList>_>_> *)
       in_RDI.d.ptr);
  QMap<ProKey,_ProStringList>::QMap
            ((QMap<ProKey,_ProStringList> *)in_RDI.d.ptr,in_stack_ffffffffffffffc8);
  std::__cxx11::list<QMap<ProKey,_ProStringList>,_std::allocator<QMap<ProKey,_ProStringList>_>_>::
  pop_back((list<QMap<ProKey,_ProStringList>,_std::allocator<QMap<ProKey,_ProStringList>_>_> *)
           in_RDI.d.ptr);
  return (QExplicitlySharedDataPointerV2<QMapData<std::map<ProKey,_ProStringList,_std::less<ProKey>,_std::allocator<std::pair<const_ProKey,_ProStringList>_>_>_>_>
          )(QExplicitlySharedDataPointerV2<QMapData<std::map<ProKey,_ProStringList,_std::less<ProKey>,_std::allocator<std::pair<const_ProKey,_ProStringList>_>_>_>_>
            )in_RDI.d.ptr;
}

Assistant:

inline ProValueMap pop() { auto r = std::move(back()); pop_back(); return r; }